

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Status __thiscall leveldb::VersionSet::WriteSnapshot(VersionSet *this,Writer *log)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  Slice *in_RDX;
  uint32_t *puVar4;
  long lVar5;
  int level;
  size_t i;
  ulong uVar6;
  string record;
  VersionEdit edit;
  Slice local_108;
  string local_f8;
  VersionEdit local_d8;
  
  VersionEdit::VersionEdit(&local_d8);
  iVar3 = (*(log[2].dest_)->_vptr_WritableFile[3])();
  local_f8._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
  local_f8._M_string_length = strlen(local_f8._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&local_d8,(Slice *)&local_f8);
  puVar4 = log[0xb].type_crc_ + 3;
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    if (*(size_t *)puVar4 != 0) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_108.data_ = *(char **)(puVar4 + -2);
      local_108.size_ = *(size_t *)puVar4;
      InternalKey::DecodeFrom((InternalKey *)&local_f8,&local_108);
      VersionEdit::SetCompactPointer(&local_d8,(int)lVar5,(InternalKey *)&local_f8);
      std::__cxx11::string::_M_dispose();
    }
    puVar4 = puVar4 + 8;
  }
  for (lVar5 = 0; lVar5 != 7; lVar5 = lVar5 + 1) {
    lVar1 = *(long *)&log[0xb].block_offset_ + lVar5 * 0x18;
    for (uVar6 = 0; lVar2 = *(long *)(lVar1 + 0x20),
        uVar6 < (ulong)(*(long *)(lVar1 + 0x28) - lVar2 >> 3); uVar6 = uVar6 + 1) {
      lVar2 = *(long *)(lVar2 + uVar6 * 8);
      VersionEdit::AddFile
                (&local_d8,(int)lVar5,*(uint64_t *)(lVar2 + 8),*(uint64_t *)(lVar2 + 0x10),
                 (InternalKey *)(lVar2 + 0x18),(InternalKey *)(lVar2 + 0x38));
    }
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  VersionEdit::EncodeTo(&local_d8,&local_f8);
  local_108.data_ = local_f8._M_dataplus._M_p;
  local_108.size_ = local_f8._M_string_length;
  leveldb::log::Writer::AddRecord((Writer *)this,in_RDX);
  std::__cxx11::string::_M_dispose();
  VersionEdit::~VersionEdit(&local_d8);
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::WriteSnapshot(log::Writer* log) {
  // TODO: Break up into multiple records to reduce memory usage on recovery?

  // Save metadata
  VersionEdit edit;
  edit.SetComparatorName(icmp_.user_comparator()->Name());

  // Save compaction pointers
  for (int level = 0; level < config::kNumLevels; level++) {
    if (!compact_pointer_[level].empty()) {
      InternalKey key;
      key.DecodeFrom(compact_pointer_[level]);
      edit.SetCompactPointer(level, key);
    }
  }

  // Save files
  for (int level = 0; level < config::kNumLevels; level++) {
    const std::vector<FileMetaData*>& files = current_->files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      edit.AddFile(level, f->number, f->file_size, f->smallest, f->largest);
    }
  }

  std::string record;
  edit.EncodeTo(&record);
  return log->AddRecord(record);
}